

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Strings.cpp
# Opt level: O1

FastString __thiscall Strings::unquotedPrintable(Strings *this,FastString *textToUnquote)

{
  byte bVar1;
  int iVar2;
  uchar *puVar3;
  bool bVar4;
  uchar *puVar5;
  uchar *puVar6;
  uchar c;
  uchar *extraout_RDX;
  byte bVar7;
  byte bVar8;
  FastString FVar9;
  FastString out;
  String local_40;
  
  Bstrlib::String::String(&local_40);
  puVar3 = (textToUnquote->super_tagbstring).data;
  iVar2 = (textToUnquote->super_tagbstring).slen;
  puVar5 = puVar3;
  do {
    if (puVar3 + iVar2 <= puVar5) {
      Bstrlib::String::String((String *)this,&local_40);
LAB_00115a42:
      Bstrlib::String::~String(&local_40);
      FVar9.super_tagbstring.data = extraout_RDX;
      FVar9.super_tagbstring._0_8_ = this;
      return (FastString)FVar9.super_tagbstring;
    }
    c = *puVar5;
    bVar4 = true;
    if (c == '=') {
      do {
        bVar8 = puVar5[1];
        if (bVar8 != 0xd) {
          bVar7 = bVar8 - 0x30;
          if (bVar7 < 10) {
LAB_0011599c:
            if ('9' < (char)bVar8) {
              if ((char)bVar8 < 'G') {
                bVar7 = bVar8 - 0x37;
              }
              else {
                bVar7 = bVar8 + 0xa9;
              }
            }
            bVar1 = puVar5[2];
            puVar6 = puVar5 + 3;
            bVar8 = bVar1 - 0x30;
            if ((bVar8 < 10) ||
               ((bVar1 - 0x41 < 0x26 && ((0x3f0000003fU >> ((ulong)(bVar1 - 0x41) & 0x3f) & 1) != 0)
                ))) {
              if ('9' < (char)bVar1) {
                if ((char)bVar1 < 'G') {
                  bVar8 = bVar1 - 0x37;
                }
                else {
                  bVar8 = bVar1 + 0xa9;
                }
              }
              c = bVar7 * '\x10' + bVar8;
              bVar4 = true;
              goto LAB_00115a01;
            }
          }
          else {
            puVar6 = puVar5 + 2;
            if (bVar8 == 10) goto LAB_00115964;
            c = '\0';
            if (bVar8 - 0x41 < 0x26) {
              bVar4 = false;
              if ((0x3f0000003fU >> ((ulong)(bVar8 - 0x41) & 0x3f) & 1) != 0) goto LAB_0011599c;
              goto LAB_00115a01;
            }
          }
          c = '\0';
          bVar4 = false;
          goto LAB_00115a01;
        }
        puVar6 = puVar5 + 3;
LAB_00115964:
        c = *puVar6;
        puVar5 = puVar6;
      } while (c == '=');
      puVar6 = puVar6 + 1;
    }
    else {
      puVar6 = puVar5 + 1;
    }
LAB_00115a01:
    if (!bVar4) {
      Bstrlib::String::String((String *)this,"");
      goto LAB_00115a42;
    }
    Bstrlib::String::operator+=(&local_40,c);
    puVar5 = puVar6;
  } while( true );
}

Assistant:

FastString unquotedPrintable(const FastString & textToUnquote)
    {
        FastString out; QuotedDecoding dec(out);
        const char * text = (const char *)textToUnquote, *end = text + textToUnquote.getLength();
        while (text < end)
        {
            char ch = 0;
            if (!dec.unquoteChar(text, ch)) return "";
            out += ch;
        }
        return out;
    }